

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::detail::equals_simple_insensitive(value_type *str1,value_type *str2)

{
  int iVar1;
  value_type *str2_local;
  value_type *str1_local;
  
  iVar1 = strcasecmp(str1,str2);
  return iVar1 == 0;
}

Assistant:

GHC_INLINE bool equals_simple_insensitive(const path::value_type* str1, const path::value_type* str2)
{
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    while (::tolower((unsigned char)*str1) == ::tolower((unsigned char)*str2++)) {
        if (*str1++ == 0)
            return true;
    }
    return false;
#else // __GNUC__
#ifdef GHC_USE_WCHAR_T
    return 0 == ::_wcsicmp(str1, str2);
#else // GHC_USE_WCHAR_T
    return 0 == ::_stricmp(str1, str2);
#endif // GHC_USE_WCHAR_T
#endif // __GNUC__
#else // GHC_OS_WINDOWS
    return 0 == ::strcasecmp(str1, str2);
#endif // GHC_OS_WINDOWS
}